

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

encryption_method_e
QPDF::interpretCF(shared_ptr<QPDF::EncryptionParameters> *encp,QPDFObjectHandle *cf)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  undefined1 local_40 [8];
  string filter;
  QPDFObjectHandle *cf_local;
  shared_ptr<QPDF::EncryptionParameters> *encp_local;
  
  filter.field_2._8_8_ = cf;
  bVar1 = QPDFObjectHandle::isName(cf);
  if (bVar1) {
    QPDFObjectHandle::getName_abi_cxx11_((string *)local_40,cf);
    peVar2 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)encp);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
            ::count(&peVar2->crypt_filters,(string *)local_40);
    if (sVar3 == 0) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"/Identity");
      if (bVar1) {
        encp_local._4_4_ = e_none;
      }
      else {
        encp_local._4_4_ = e_unknown;
      }
    }
    else {
      peVar2 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)encp);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
               ::operator[](&peVar2->crypt_filters,(key_type *)local_40);
      encp_local._4_4_ = *pmVar4;
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    encp_local._4_4_ = e_none;
  }
  return encp_local._4_4_;
}

Assistant:

QPDF::encryption_method_e
QPDF::interpretCF(std::shared_ptr<EncryptionParameters> encp, QPDFObjectHandle cf)
{
    if (cf.isName()) {
        std::string filter = cf.getName();
        if (encp->crypt_filters.count(filter) != 0) {
            return encp->crypt_filters[filter];
        } else if (filter == "/Identity") {
            return e_none;
        } else {
            return e_unknown;
        }
    } else {
        // Default: /Identity
        return e_none;
    }
}